

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_secp256k1.cpp
# Opt level: O2

ByteData * __thiscall
cfd::core::Secp256k1::MulTweakPubkeySecp256k1Ec
          (ByteData *__return_storage_ptr__,Secp256k1 *this,ByteData *pubkey,ByteData *tweak)

{
  secp256k1_context *ctx;
  size_t sVar1;
  CfdException *pCVar2;
  allocator local_dd;
  int ret;
  undefined1 local_d8 [32];
  size_t byte_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_data;
  secp256k1_pubkey tweaked;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tweak_data;
  
  ctx = (secp256k1_context *)this->secp256k1_context_;
  if (ctx == (secp256k1_context *)0x0) {
    tweaked.data._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
         + 99;
    tweaked.data[8] = 'M';
    tweaked.data[9] = '\x01';
    tweaked.data[10] = '\0';
    tweaked.data[0xb] = '\0';
    tweaked.data._16_8_ = anon_var_dwarf_4558d3;
    logger::warn<>((CfdSourceLocation *)&tweaked,"Secp256k1 context is NULL.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&tweaked,"Secp256k1 context is NULL.",(allocator *)local_d8);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&tweaked);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar1 = ByteData::GetDataSize(pubkey);
  if (sVar1 != 0x21) {
    tweaked.data._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
         + 99;
    tweaked.data[8] = 'R';
    tweaked.data[9] = '\x01';
    tweaked.data[10] = '\0';
    tweaked.data[0xb] = '\0';
    tweaked.data._16_8_ = anon_var_dwarf_4558d3;
    logger::warn<>((CfdSourceLocation *)&tweaked,"Invalid Argument pubkey size.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)&tweaked,"Invalid Pubkey size.",(allocator *)local_d8);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&tweaked);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar1 = ByteData::GetDataSize(tweak);
  if (sVar1 != 0x20) {
    tweaked.data._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
         + 99;
    tweaked.data[8] = 'W';
    tweaked.data[9] = '\x01';
    tweaked.data[10] = '\0';
    tweaked.data[0xb] = '\0';
    tweaked.data._16_8_ = anon_var_dwarf_4558d3;
    logger::warn<>((CfdSourceLocation *)&tweaked,"Invalid Argument tweak size.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)&tweaked,"Invalid tweak size.",(allocator *)local_d8);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&tweaked);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::GetBytes(&pubkey_data,pubkey);
  ByteData::GetBytes(&tweak_data,tweak);
  ret = secp256k1_ec_pubkey_parse
                  (ctx,(secp256k1_pubkey_conflict *)&tweaked,
                   pubkey_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)pubkey_data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)pubkey_data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start);
  if (ret == 1) {
    ret = secp256k1_ec_pubkey_tweak_mul
                    (ctx,(secp256k1_pubkey_conflict *)&tweaked,
                     tweak_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
    if (ret != 1) {
      local_d8._0_8_ = "cfdcore_secp256k1.cpp";
      local_d8._8_4_ = 0x16c;
      local_d8._16_8_ = "MulTweakPubkeySecp256k1Ec";
      logger::warn<int&>((CfdSourceLocation *)local_d8,"secp256k1_ec_pubkey_tweak_add Error.({})",
                         &ret);
      pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)local_d8,"Secp256k1 pubkey tweak Error.",(allocator *)&byte_data);
      CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_d8);
      __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&byte_data,0x41,
               (allocator_type *)local_d8);
    byte_size = (long)byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
    ret = secp256k1_ec_pubkey_serialize
                    (ctx,byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,&byte_size,
                     (secp256k1_pubkey_conflict *)&tweaked,0x102);
    if (ret == 1) {
      if (byte_size == 0x21) {
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&byte_data,0x21);
        ByteData::ByteData(__return_storage_ptr__,&byte_data);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&tweak_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&pubkey_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        return __return_storage_ptr__;
      }
      local_d8._0_8_ = "cfdcore_secp256k1.cpp";
      local_d8._8_4_ = 0x17f;
      local_d8._16_8_ = "MulTweakPubkeySecp256k1Ec";
      logger::warn<unsigned_long&>
                ((CfdSourceLocation *)local_d8,
                 "secp256k1_ec_pubkey_serialize pubkey length Error.({})",&byte_size);
      pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string((string *)local_d8,"Secp256k1 pubkey length Error.",&local_dd);
      CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_d8);
      __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_d8._0_8_ = "cfdcore_secp256k1.cpp";
    local_d8._8_4_ = 0x177;
    local_d8._16_8_ = "MulTweakPubkeySecp256k1Ec";
    logger::warn<int&>((CfdSourceLocation *)local_d8,"secp256k1_ec_pubkey_serialize Error.({})",&ret
                      );
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)local_d8,"Secp256k1 pubkey serialize Error.",&local_dd)
    ;
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_d8);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_d8._0_8_ = "cfdcore_secp256k1.cpp";
  local_d8._8_4_ = 0x164;
  local_d8._16_8_ = "MulTweakPubkeySecp256k1Ec";
  logger::warn<int&>((CfdSourceLocation *)local_d8,"secp256k1_ec_pubkey_parse Error.({})",&ret);
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)local_d8,"Secp256k1 pubkey parse Error.",(allocator *)&byte_data);
  CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_d8);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData Secp256k1::MulTweakPubkeySecp256k1Ec(
    const ByteData& pubkey, const ByteData& tweak) {
  secp256k1_context* context =
      static_cast<secp256k1_context*>(secp256k1_context_);

  if (secp256k1_context_ == NULL) {
    warn(CFD_LOG_SOURCE, "Secp256k1 context is NULL.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 context is NULL.");
  }
  if (pubkey.GetDataSize() != kCompressedPubkeyByteSize) {
    warn(CFD_LOG_SOURCE, "Invalid Argument pubkey size.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid Pubkey size.");
  }
  if (tweak.GetDataSize() != kTweakByteSize) {
    warn(CFD_LOG_SOURCE, "Invalid Argument tweak size.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid tweak size.");
  }

  int ret;
  std::vector<uint8_t> pubkey_data = pubkey.GetBytes();
  std::vector<uint8_t> tweak_data = tweak.GetBytes();
  secp256k1_pubkey tweaked;
  secp256k1_pubkey watchman;
  ret = secp256k1_ec_pubkey_parse(
      context, &tweaked, pubkey_data.data(), pubkey_data.size());
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "secp256k1_ec_pubkey_parse Error.({})", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 pubkey parse Error.");
  }
  memcpy(&watchman, &tweaked, sizeof(watchman));

  ret = secp256k1_ec_pubkey_tweak_mul(context, &tweaked, tweak_data.data());
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "secp256k1_ec_pubkey_tweak_add Error.({})", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 pubkey tweak Error.");
  }

  std::vector<uint8_t> byte_data(kFullPubkeyByteSize);
  size_t byte_size = byte_data.size();
  ret = secp256k1_ec_pubkey_serialize(
      context, byte_data.data(), &byte_size, &tweaked,
      SECP256K1_EC_COMPRESSED);
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "secp256k1_ec_pubkey_serialize Error.({})", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Secp256k1 pubkey serialize Error.");
  }

  if (byte_size != kCompressedPubkeyByteSize) {
    warn(
        CFD_LOG_SOURCE,
        "secp256k1_ec_pubkey_serialize pubkey length Error.({})", byte_size);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 pubkey length Error.");
  }
  byte_data.resize(byte_size);
  return ByteData(byte_data);
}